

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultVerify.cpp
# Opt level: O3

void mult_verify::MultVerifyInt32Int32(void)

{
  return;
}

Assistant:

void MultVerifyInt32Int32()
{
	TestVector< std::int32_t, std::int32_t, OpType::Mult > tests;
	TestCase<std::int32_t, std::int32_t, OpType::Mult > test = tests.GetNext();

	while (!tests.Done())
	{
		std::int32_t ret;
		if (SafeMultiply(test.x, test.y, ret) != test.fExpected)
		{
			//assert(false);
			err_msg("Error in case int32_int32: ", test.x, test.y, test.fExpected);
		}

		bool fSuccess = true;
		try
		{
			SafeInt<std::int32_t> si(test.x);
			si *= test.y;
		}
		catch (...)
		{
			fSuccess = false;
		}

		if (fSuccess != test.fExpected)
		{
			err_msg("Error in case int32_int32 throw: ", test.x, test.y, test.fExpected);
		}

		test = tests.GetNext();
	}
}